

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_in_out.cpp
# Opt level: O2

OperatorFinalizeResultType __thiscall
ThrottlingSum::Finalize
          (ThrottlingSum *this,ExecutionContext *context,TableFunctionInput *data_p,
          DataChunk *output)

{
  ulong __n;
  LocalTableFunctionState *pLVar1;
  reference pvVar2;
  bool bVar3;
  Value local_50 [64];
  
  pLVar1 = duckdb::optional_ptr<duckdb::LocalTableFunctionState,_true>::operator->
                     ((optional_ptr<duckdb::LocalTableFunctionState,_true> *)(context + 8));
  __n = *(ulong *)(pLVar1 + 0x20);
  bVar3 = (ulong)(*(long *)(pLVar1 + 0x10) - *(long *)(pLVar1 + 8) >> 2) <= __n;
  if (!bVar3) {
    *(undefined8 *)(data_p + 0x18) = 1;
    *(ulong *)(pLVar1 + 0x20) = __n + 1;
    pvVar2 = duckdb::vector<int,_true>::get<true>((vector<int,_true> *)(pLVar1 + 8),__n);
    duckdb::Value::Value(local_50,*pvVar2);
    duckdb::DataChunk::SetValue((ulong)data_p,0,(Value *)0x0);
    duckdb::Value::~Value(local_50);
  }
  return bVar3;
}

Assistant:

static OperatorFinalizeResultType Finalize(ExecutionContext &context, TableFunctionInput &data_p,
	                                           DataChunk &output) {
		auto &local_state = data_p.local_state->Cast<ThrottlingSum::ThrottlingSumLocalData>();

		if (local_state.current_idx < local_state.row_sums.size()) {
			output.SetCardinality(1);
			output.SetValue(0, 0, Value(local_state.row_sums[local_state.current_idx++]));
			return OperatorFinalizeResultType::HAVE_MORE_OUTPUT;
		} else {
			return OperatorFinalizeResultType::FINISHED;
		}
	}